

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_for_statement_tree(FILE *out,AST_For_Statement *fo)

{
  fwrite("for(\n",5,1,(FILE *)out);
  print_ast(out,fo->initialisation);
  fwrite(";\n",2,1,(FILE *)out);
  print_ast(out,fo->condition);
  fwrite(";\n",2,1,(FILE *)out);
  print_ast(out,fo->update);
  fwrite(")\n",2,1,(FILE *)out);
  print_ast(out,fo->body_statement);
  return;
}

Assistant:

void print_for_statement_tree(FILE *out,struct AST_For_Statement *fo)
{
	fprintf(out,"for(\n");
	print_ast(out,fo->initialisation);
	fprintf(out,";\n");
	print_ast(out,fo->condition);
	fprintf(out,";\n");
	print_ast(out,fo->update);
	fprintf(out,")\n");
	print_ast(out,fo->body_statement);
}